

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCTest *this_00;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string top_dir;
  string git;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule_sync;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule;
  string sync_recursive;
  string recursive;
  string init_submodules;
  OutputLogger submodule_err;
  OutputLogger submodule_out;
  allocator_type local_249;
  string local_248;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  long *local_208 [2];
  long local_1f8 [2];
  uint local_1e4;
  string local_1e0;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  value_type local_170;
  value_type local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  OutputLogger local_b0;
  OutputLogger local_70;
  
  bVar3 = UpdateInternal(this);
  if (!bVar3) {
    return false;
  }
  FindTopDir_abi_cxx11_(&local_1e0,this);
  local_1c0 = local_1b0;
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"--recursive","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"--recursive","");
  uVar4 = GetGitVersion(this);
  paVar1 = &local_248.field_2;
  if (uVar4 < 0xa1d1c8) {
    local_248._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
    std::__cxx11::string::append((char *)&local_248);
    bVar3 = cmsys::SystemTools::FileExists(&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "Git < 1.6.5 cannot update submodules recursively\n",0x31);
    }
  }
  uVar5 = GetGitVersion(this);
  if (uVar5 < 0xa4cf68) {
    local_248._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
    std::__cxx11::string::append((char *)&local_248);
    bVar3 = cmsys::SystemTools::FileExists(&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "Git < 1.8.1 cannot synchronize submodules recursively\n",0x36);
    }
  }
  cmProcessTools::OutputLogger::OutputLogger
            (&local_70,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_b0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-err> ");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"GITInitSubmodules","");
  cmCTest::GetCTestConfiguration(&local_d0,this_00,&local_248);
  pcVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    pcVar6 = extraout_RDX_00;
  }
  value._M_str = pcVar6;
  value._M_len = (size_t)local_d0._M_dataplus._M_p;
  bVar3 = cmValue::IsOn((cmValue *)local_d0._M_string_length,value);
  if (bVar3) {
    local_248._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_1c0,local_1b8 + (long)local_1c0);
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"submodule","");
    plVar7 = local_1f8;
    local_208[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"init","");
    __l._M_len = 3;
    __l._M_array = &local_248;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1a0,__l,(allocator_type *)&local_188);
    lVar8 = -0x60;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
    bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,&local_1a0,(OutputParser *)&local_70,
                                (OutputParser *)&local_b0,&local_f0,Auto);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a0);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_00249238;
    }
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_1e4 = uVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_1c0,local_1b8 + (long)local_1c0);
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"submodule","");
  plVar7 = local_1f8;
  local_208[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"sync","");
  __l_00._M_len = 3;
  __l_00._M_array = &local_248;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a0,__l_00,(allocator_type *)&local_188);
  lVar8 = -0x60;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  if (0xa4cf67 < uVar5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_1a0,&local_170);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,&local_1a0,(OutputParser *)&local_70,
                              (OutputParser *)&local_b0,&local_110,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_1c0,local_1b8 + (long)local_1c0);
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"submodule","");
    plVar7 = local_1f8;
    local_208[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"update","");
    __l_01._M_len = 3;
    __l_01._M_array = &local_248;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_188,__l_01,&local_249);
    lVar8 = -0x60;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if (0xa1d1c7 < local_1e4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_188,&local_150);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
    bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,&local_188,(OutputParser *)&local_70,
                                (OutputParser *)&local_b0,&local_130,Auto);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
  }
  else {
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0);
LAB_00249238:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_b0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.super_LineParser.Line._M_dataplus._M_p != &local_b0.super_LineParser.Line.field_2)
  {
    operator_delete(local_b0.super_LineParser.Line._M_dataplus._M_p,
                    local_b0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_70.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_LineParser.Line._M_dataplus._M_p != &local_70.super_LineParser.Line.field_2)
  {
    operator_delete(local_70.super_LineParser.Line._M_dataplus._M_p,
                    local_70.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if (!this->UpdateInternal()) {
    return false;
  }

  std::string top_dir = this->FindTopDir();
  std::string git = this->CommandLineTool;
  std::string recursive = "--recursive";
  std::string sync_recursive = "--recursive";

  // Git < 1.6.5 did not support submodule --recursive
  bool support_recursive = true;
  if (this->GetGitVersion() < cmCTestGITVersion(1, 6, 5, 0)) {
    support_recursive = false;
    // No need to require >= 1.6.5 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.6.5 cannot update submodules recursively\n";
    }
  }

  // Git < 1.8.1 did not support sync --recursive
  bool support_sync_recursive = true;
  if (this->GetGitVersion() < cmCTestGITVersion(1, 8, 1, 0)) {
    support_sync_recursive = false;
    // No need to require >= 1.8.1 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.8.1 cannot synchronize submodules recursively\n";
    }
  }

  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");

  bool ret;

  std::string init_submodules =
    this->CTest->GetCTestConfiguration("GITInitSubmodules");
  if (cmIsOn(init_submodules)) {
    std::vector<std::string> git_submodule_init = { git, "submodule", "init" };
    ret = this->RunChild(git_submodule_init, &submodule_out, &submodule_err,
                         top_dir);

    if (!ret) {
      return false;
    }
  }

  std::vector<std::string> git_submodule_sync = { git, "submodule", "sync" };
  if (support_sync_recursive) {
    git_submodule_sync.push_back(sync_recursive);
  }
  ret = this->RunChild(git_submodule_sync, &submodule_out, &submodule_err,
                       top_dir);

  if (!ret) {
    return false;
  }

  std::vector<std::string> git_submodule = { git, "submodule", "update" };
  if (support_recursive) {
    git_submodule.push_back(recursive);
  }
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir);
}